

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

void bcread_error(LexState *ls,ErrMsg em)

{
  char cVar1;
  uint in_EDX;
  char *pcVar2;
  undefined4 in_register_00000034;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,em);
  cVar1 = *pcVar2;
  if (cVar1 == '\x1b') {
    pcVar2 = "(binary)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar2 = pcVar2 + 1;
  }
  lj_strfmt_pushf((lua_State *)ls,"%s: %s",pcVar2,lj_err_allmsg + in_EDX);
  lj_err_throw((lua_State *)ls,3);
}

Assistant:

static LJ_NOINLINE void bcread_error(LexState *ls, ErrMsg em)
{
  lua_State *L = ls->L;
  const char *name = ls->chunkarg;
  if (*name == BCDUMP_HEAD1) name = "(binary)";
  else if (*name == '@' || *name == '=') name++;
  lj_strfmt_pushf(L, "%s: %s", name, err2msg(em));
  lj_err_throw(L, LUA_ERRSYNTAX);
}